

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.hpp
# Opt level: O0

void __thiscall ear::ScreenEdgeLock::~ScreenEdgeLock(ScreenEdgeLock *this)

{
  ScreenEdgeLock *this_local;
  
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional(&this->vertical);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional(&this->horizontal);
  return;
}

Assistant:

struct EAR_EXPORT ScreenEdgeLock {
    /// `screenEdgeLock` attribute on `position` element with
    /// `coordinate="azimuth"` or `coordinate="X"`
    boost::optional<std::string> horizontal;
    /// `screenEdgeLock` attribute on `position` element with
    /// `coordinate="elevation"` or `coordinate="Z"`
    boost::optional<std::string> vertical;
  }